

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxCompoundStatement::Emit(FxCompoundStatement *this,VMFunctionBuilder *build)

{
  FxLocalVariableDeclaration **ppFVar1;
  long lVar2;
  ExpEmit EVar3;
  long lVar4;
  ulong uVar5;
  
  if ((this->super_FxSequence).Expressions.super_TArray<FxExpression_*,_FxExpression_*>.Count != 0)
  {
    uVar5 = 0;
    do {
      FxExpression::EmitStatement
                ((this->super_FxSequence).Expressions.super_TArray<FxExpression_*,_FxExpression_*>.
                 Array[uVar5],build);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->super_FxSequence).Expressions.
                     super_TArray<FxExpression_*,_FxExpression_*>.Count);
  }
  uVar5 = (ulong)(this->LocalVars).Count;
  if (uVar5 != 0) {
    ppFVar1 = (this->LocalVars).Array;
    lVar4 = 0;
    do {
      lVar2 = *(long *)((long)ppFVar1 + lVar4);
      if (*(int *)(lVar2 + 0x44) != -1) {
        VMFunctionBuilder::RegAvailability::Return
                  (build->Registers + *(byte *)(*(long *)(lVar2 + 0x18) + 0x6b),
                   *(int *)(lVar2 + 0x44),*(int *)(lVar2 + 0x3c));
      }
      lVar4 = lVar4 + 8;
    } while (uVar5 << 3 != lVar4);
  }
  EVar3.RegNum = 0;
  EVar3.RegType = 0x80;
  EVar3.RegCount = '\x01';
  EVar3.Konst = false;
  EVar3.Fixed = false;
  EVar3.Final = false;
  EVar3.Target = false;
  return EVar3;
}

Assistant:

ExpEmit FxCompoundStatement::Emit(VMFunctionBuilder *build)
{
	auto e = FxSequence::Emit(build);
	// Release all local variables in this block.
	for (auto l : LocalVars)
	{
		l->Release(build);
	}
	return e;
}